

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstylesheetstyle.cpp
# Opt level: O0

QRect __thiscall QRenderRule::boxRect(QRenderRule *this,QRect *cr,int flags)

{
  long lVar1;
  undefined8 uVar2;
  QRect QVar3;
  undefined1 auVar4 [12];
  bool bVar5;
  uint in_EDX;
  undefined1 (*in_RSI) [12];
  QRect *in_RDI;
  long in_FS_OFFSET;
  int *b;
  int *p;
  int *m;
  QRect r;
  int in_stack_ffffffffffffffa0;
  int in_stack_ffffffffffffffa4;
  int in_stack_ffffffffffffffa8;
  int in_stack_ffffffffffffffac;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  uVar2 = *(undefined8 *)(*in_RSI + 8);
  auVar4 = *in_RSI;
  bVar5 = hasBox((QRenderRule *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
  if (bVar5) {
    if ((in_EDX & 1) != 0) {
      box((QRenderRule *)0x423ad0);
      QRect::adjust(in_RDI,in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8,
                    in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0);
    }
    if ((in_EDX & 4) != 0) {
      box((QRenderRule *)0x423b1d);
      QRect::adjust(in_RDI,in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8,
                    in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0);
    }
  }
  bVar5 = hasBorder((QRenderRule *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
  if ((bVar5) && ((in_EDX & 2) != 0)) {
    border((QRenderRule *)0x423b7c);
    QRect::adjust(in_RDI,in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8,
                  in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  QVar3.y2.m_i = (int)((ulong)uVar2 >> 0x20);
  QVar3._0_12_ = auVar4;
  return QVar3;
}

Assistant:

QRect QRenderRule::boxRect(const QRect& cr, int flags) const
{
    QRect r = cr;
    if (hasBox()) {
        if (flags & Margin) {
            const int *m = box()->margins;
            r.adjust(-m[LeftEdge], -m[TopEdge], m[RightEdge], m[BottomEdge]);
        }
        if (flags & Padding) {
            const int *p = box()->paddings;
            r.adjust(-p[LeftEdge], -p[TopEdge], p[RightEdge], p[BottomEdge]);
        }
    }
    if (hasBorder() && (flags & Border)) {
        const int *b = border()->borders;
        r.adjust(-b[LeftEdge], -b[TopEdge], b[RightEdge], b[BottomEdge]);
    }
    return r;
}